

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxUniformBlocksTest::getShaderParts
          (GeometryShaderMaxUniformBlocksTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLchar *pGVar3;
  ostream *poVar4;
  string local_240 [36];
  int local_21c;
  string local_218 [4];
  GLint uniform_block_nr;
  string local_1f8 [48];
  long local_1c8;
  stringstream stream;
  ostream local_1b8;
  long local_40;
  Functions *gl;
  GLchar ***out_vertex_shader_parts_local;
  uint *out_n_geometry_shader_parts_local;
  GLchar ***out_geometry_shader_parts_local;
  uint *out_n_fragment_shader_parts_local;
  GLchar ***out_fragment_shader_parts_local;
  GeometryShaderMaxUniformBlocksTest *this_local;
  
  gl = (Functions *)out_vertex_shader_parts;
  out_vertex_shader_parts_local = (GLchar ***)out_n_geometry_shader_parts;
  out_n_geometry_shader_parts_local = (uint *)out_geometry_shader_parts;
  out_geometry_shader_parts_local = (GLchar ***)out_n_fragment_shader_parts;
  out_n_fragment_shader_parts_local = (uint *)out_fragment_shader_parts;
  out_fragment_shader_parts_local = (GLchar ***)this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
                      m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_40 = CONCAT44(extraout_var,iVar1);
  *(undefined ***)out_n_fragment_shader_parts_local = &m_fragment_shader_code;
  *(undefined4 *)out_geometry_shader_parts_local = 1;
  (**(code **)(local_40 + 0x868))
            ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
             m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS,&this->m_max_uniform_blocks);
  err = (**(code **)(local_40 + 0x800))();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x5db);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8);
  std::ostream::operator<<(&local_1b8,this->m_max_uniform_blocks);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_max_uniform_blocks_string,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  this->m_geometry_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(points)                 in;\nlayout(points, max_vertices=1) out;\n\n// definition of NUMBER_OF_UNIFORMS goes here\n"
  ;
  this->m_geometry_shader_parts[1] = "#define NUMBER_OF_UNIFORM_BLOCKS ";
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  this->m_geometry_shader_parts[2] = pGVar3;
  this->m_geometry_shader_parts[3] =
       "u\n\nlayout(binding = 0) uniform UniformBlock\n{\n    int entry;\n} uni_block_array[NUMBER_OF_UNIFORM_BLOCKS];\n\nflat out int gs_out_sum;\n\nvoid main()\n{\n    gs_out_sum = 0;\n\n"
  ;
  std::__cxx11::string::string(local_218);
  std::__cxx11::stringstream::str((string *)&local_1c8);
  std::__cxx11::string::~string(local_218);
  std::ios::clear((long)&local_1c8 + *(long *)(local_1c8 + -0x18),0);
  for (local_21c = 0; local_21c < this->m_max_uniform_blocks; local_21c = local_21c + 1) {
    poVar4 = std::operator<<(&local_1b8,"    gs_out_sum += uni_block_array[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_21c);
    std::operator<<(poVar4,"].entry;\n");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_uniform_block_access_string,local_240);
  std::__cxx11::string::~string(local_240);
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  this->m_geometry_shader_parts[4] = pGVar3;
  this->m_geometry_shader_parts[5] = "\n    EmitVertex();\n\n    EndPrimitive();\n}\n";
  *(GLchar ***)out_n_geometry_shader_parts_local = this->m_geometry_shader_parts;
  *(undefined4 *)out_vertex_shader_parts_local = 6;
  gl->activeShaderProgram = (glActiveShaderProgramFunc)&m_vertex_shader_code;
  *out_n_vertex_shader_parts = 1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8);
  return;
}

Assistant:

void GeometryShaderMaxUniformBlocksTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
														unsigned int&			   out_n_fragment_shader_parts,
														const glw::GLchar* const*& out_geometry_shader_parts,
														unsigned int&			   out_n_geometry_shader_parts,
														const glw::GLchar* const*& out_vertex_shader_parts,
														unsigned int&			   out_n_vertex_shader_parts)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fragment Shader */
	out_fragment_shader_parts   = &m_fragment_shader_code;
	out_n_fragment_shader_parts = 1;

	/* Get maximum number of uniform blocks */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &m_max_uniform_blocks);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT");

	std::stringstream stream;
	stream << m_max_uniform_blocks;
	m_max_uniform_blocks_string = stream.str();

	/* Geometry Shader */
	m_geometry_shader_parts[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts[1] = m_geometry_shader_code_number_of_uniforms;
	m_geometry_shader_parts[2] = m_max_uniform_blocks_string.c_str();
	m_geometry_shader_parts[3] = m_geometry_shader_code_body_str;

	stream.str(std::string());
	stream.clear();
	for (glw::GLint uniform_block_nr = 0; uniform_block_nr < m_max_uniform_blocks; ++uniform_block_nr)
	{
		stream << "    gs_out_sum += uni_block_array[" << uniform_block_nr << "].entry;\n";
	}
	m_uniform_block_access_string = stream.str();

	m_geometry_shader_parts[4] = m_uniform_block_access_string.c_str();
	m_geometry_shader_parts[5] = m_geometry_shader_code_body_end;

	out_geometry_shader_parts   = m_geometry_shader_parts;
	out_n_geometry_shader_parts = 6;

	/* Vertex Shader */
	out_vertex_shader_parts   = &m_vertex_shader_code;
	out_n_vertex_shader_parts = 1;
}